

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxyd.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  _func_void *p_Var2;
  int iVar3;
  __pid_t _Var4;
  char *pcVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined4 local_e4;
  pid_t sid;
  pid_t pid;
  int ret;
  sigaction sigact;
  proxy_opts opts;
  char **argv_local;
  int argc_local;
  
  memset(&sigact.sa_restorer,0,0x18);
  memset(&pid,0,0x98);
  memset(&ph,0,0x58);
  parse_args(argc,argv,(proxy_opts *)&sigact.sa_restorer);
  if (sigact.sa_restorer == (_func_void *)0x0) {
    sigact.sa_restorer = (_func_void *)proxy_config_hint();
  }
  _pid = graceful_shutdown;
  sigact.sa_mask.__val[0xf]._0_4_ = (uint)sigact.sa_mask.__val[0xf] | 4;
  sigaction(2,(sigaction *)&pid,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)&pid,(sigaction *)0x0);
  sigaction(10,(sigaction *)&pid,(sigaction *)0x0);
  sid = proxy_init();
  pFVar1 = _stderr;
  if (sid < 0) {
    pcVar5 = strerror(-sid);
    fprintf(pFVar1,"Failed to initialize proxy (%d): %s\n",(ulong)(uint)-sid,pcVar5);
  }
  else {
    if (opts.log_path._4_1_ == '\0') {
      local_e4 = 3;
      if ((char)opts.log_path != '\0') {
        local_e4 = 4;
      }
    }
    else {
      local_e4 = 2;
    }
    proxy_log_level(&ph,local_e4);
    sid = proxy_log_select_medium(&ph,1,0);
    pFVar1 = _stderr;
    if (sid < 0) {
      pcVar5 = strerror(-sid);
      fprintf(pFVar1,"Failed to switch log to STDOUT (%d): %s\n",(ulong)(uint)-sid,pcVar5);
    }
    else {
      sid = proxy_load_conf(&ph,sigact.sa_restorer);
      p_Var2 = sigact.sa_restorer;
      if (sid < 0) {
        pcVar5 = strerror(-sid);
        proxy_log(&ph,0,"Failed to load config from \'%s\' (%d): %s\n",p_Var2,-sid,pcVar5);
      }
      else {
        sid = proxy_open();
        if (sid < 0) {
          pcVar5 = strerror(-sid);
          proxy_log(&ph,0,"Failed to open proxy (%d): %s\n",-sid,pcVar5);
        }
        else {
          if (opts.log_path._2_1_ == '\0') {
            sid = fork();
            if (sid < 0) {
              proxy_log(&ph,0,"Error forking daemon process\n");
              goto LAB_00101aee;
            }
            if (0 < sid) {
              exit(0);
            }
            if (opts.config_path == (char *)0x0) {
              if (opts.log_path._3_1_ != '\0') {
                iVar3 = proxy_log_select_medium(&ph,3,0);
                if (iVar3 != 0) {
                  pcVar5 = strerror(-iVar3);
                  proxy_log(&ph,1,"Failed to activate syslog (%d): %s\n",-iVar3,pcVar5);
                }
                uVar7 = 3;
                if ((char)opts.log_path != '\0') {
                  uVar7 = 4;
                }
                proxy_log_level(&ph,uVar7);
              }
            }
            else {
              iVar3 = proxy_log_select_medium(&ph,2,opts.config_path);
              if (iVar3 != 0) {
                pcVar5 = strerror(-iVar3);
                proxy_log(&ph,1,"Failed to open log file (%d): %s\n",-iVar3,pcVar5);
              }
              uVar7 = 3;
              if ((char)opts.log_path != '\0') {
                uVar7 = 4;
              }
              proxy_log_level(&ph,uVar7);
            }
            umask(0);
            _Var4 = setsid();
            if (_Var4 < 0) {
              piVar6 = __errno_location();
              iVar3 = *piVar6;
              piVar6 = __errno_location();
              pcVar5 = strerror(*piVar6);
              proxy_log(&ph,0,"Process error (%d): %s\n",iVar3,pcVar5);
              piVar6 = __errno_location();
              sid = *piVar6;
              goto LAB_00101aee;
            }
            iVar3 = chdir("/");
            if (iVar3 < 0) {
              piVar6 = __errno_location();
              iVar3 = *piVar6;
              piVar6 = __errno_location();
              pcVar5 = strerror(*piVar6);
              proxy_log(&ph,0,"Failed to change dir (%d): %s\n",iVar3,pcVar5);
              piVar6 = __errno_location();
              sid = *piVar6;
              goto LAB_00101aee;
            }
            close(0);
            close(1);
            close(2);
          }
          else if (opts.config_path == (char *)0x0) {
            if (opts.log_path._3_1_ == '\0') {
              if (opts.log_path._1_1_ != '\0') {
                proxy_log(&ph,3,"Switching log to eventlog\n");
                iVar3 = proxy_log_select_medium(&ph,4,0);
                if (iVar3 != 0) {
                  pcVar5 = strerror(-iVar3);
                  proxy_log(&ph,1,"Failed to activate eventlog (%d): %s\n",-iVar3,pcVar5);
                }
              }
            }
            else {
              proxy_log(&ph,3,"Switching log to syslog\n");
              iVar3 = proxy_log_select_medium(&ph,3,0);
              if (iVar3 != 0) {
                pcVar5 = strerror(-iVar3);
                proxy_log(&ph,1,"Failed to activate syslog (%d): %s\n",-iVar3,pcVar5);
              }
            }
          }
          else {
            proxy_log(&ph,3,"Switching log to file \"%s\"\n",opts.config_path);
            iVar3 = proxy_log_select_medium(&ph,2,opts.config_path);
            if (iVar3 != 0) {
              pcVar5 = strerror(-iVar3);
              proxy_log(&ph,1,"Failed to open log file (%d): %s\n",-iVar3,pcVar5);
            }
          }
          sid = proxy_start();
          if (sid < 0) {
            pcVar5 = strerror(-sid);
            proxy_log(&ph,0,"Failed to start proxy (%d): %s\n",-sid,pcVar5);
          }
          else {
            proxy_log(&ph,3,"Ready.\n");
            while (sid == 0 && sentinel == '\0') {
              proxy_log(&ph,4,"Starting a processing run...\n");
              sid = proxy_process();
              if (sid < 0) {
                if (sid == -4) {
                  sid = 0;
                  while (sentinel == '\0') {
                    usleep(50000);
                  }
                }
                else {
                  pcVar5 = strerror(-sid);
                  proxy_log(&ph,0,"Message processing failure (%d): %s\n",-sid,pcVar5);
                }
              }
            }
            proxy_log(&ph,3,"Shutting down...\n");
          }
        }
      }
    }
  }
LAB_00101aee:
  proxy_free(&ph);
  return sid;
}

Assistant:

int main(int argc, const char * const argv[])
{
	struct proxy_opts opts;

#ifndef _WIN32
	struct sigaction sigact;
#endif
	int ret;

	memset(&opts, 0x0, sizeof(opts));
#ifndef _WIN32
	memset(&sigact, 0x0, sizeof(sigact));
#endif
	memset(&ph, 0x0, sizeof(ph));

	parse_args(argc, argv, &opts);
	if (opts.config_path == NULL) {
#ifdef OPENELP_CONFIG_HINT
		opts.config_path = proxy_config_hint();
#else
		opts.config_path = config_path_default;
#endif
	}

#ifndef _WIN32
	/* Handle SIGINT/SIGTERM */
	sigact.sa_sigaction = graceful_shutdown;
	sigact.sa_flags |= SA_SIGINFO;

	sigaction(SIGINT, &sigact, NULL);
	sigaction(SIGTERM, &sigact, NULL);
	sigaction(SIGUSR1, &sigact, NULL);
#else
	if (!SetConsoleCtrlHandler(graceful_shutdown, TRUE))
		fprintf(stderr, "Failed to set signal handler (%d)\n",
			GetLastError());

#endif

	/* Initialize proxy */
	ret = proxy_init(&ph);
	if (ret < 0) {
		fprintf(stderr, "Failed to initialize proxy (%d): %s\n", -ret,
			strerror(-ret));
		goto proxyd_exit;
	}

	/* Set the initial logging level */
	proxy_log_level(&ph, opts.quiet ? LOG_LEVEL_WARN : opts.debug ?
			LOG_LEVEL_DEBUG : LOG_LEVEL_INFO);

	/* Open the log */
	ret = proxy_log_select_medium(&ph, LOG_MEDIUM_STDOUT, NULL);
	if (ret < 0) {
		fprintf(stderr, "Failed to switch log to STDOUT (%d): %s\n",
			-ret, strerror(-ret));
		goto proxyd_exit;
	}

	/* Load the config */
	ret = proxy_load_conf(&ph, opts.config_path);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to load config from '%s' (%d): %s\n",
			  opts.config_path, -ret, strerror(-ret));
		goto proxyd_exit;
	}

	/* Start listening */
	ret = proxy_open(&ph);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to open proxy (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxyd_exit;
	}

#ifndef _WIN32
	/* Daemonize */
	if (!opts.foreground) {
		pid_t pid;
		pid_t sid;

		pid = fork();

		if (pid < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Error forking daemon process\n");
			ret = pid;
			goto proxyd_exit;
		}

		if (pid > 0)
			exit(0);

		/*! @TODO Double-fork */

		if (opts.log_path) {
			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_FILE,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to open log file (%d): %s\n",
					  -ret, strerror(-ret));
			proxy_log_level(&ph, opts.debug ? LOG_LEVEL_DEBUG :
					LOG_LEVEL_INFO);
		} else if (opts.syslog) {
			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_SYSLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate syslog (%d): %s\n",
					  -ret, strerror(-ret));
			proxy_log_level(&ph, opts.debug ? LOG_LEVEL_DEBUG :
					LOG_LEVEL_INFO);
		}

		umask(0);

		sid = setsid();
		if (sid < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Process error (%d): %s\n",
				  errno, strerror(errno));
			ret = errno;
			goto proxyd_exit;
		}

		if (chdir("/") < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Failed to change dir (%d): %s\n",
				  errno, strerror(errno));
			ret = errno;
			goto proxyd_exit;
		}

		close(STDIN_FILENO);
		close(STDOUT_FILENO);
		close(STDERR_FILENO);
	} else
#endif
	{
		/* Switch log, if necessary */
		if (opts.log_path) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to file \"%s\"\n",
				  opts.log_path);

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_FILE,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to open log file (%d): %s\n",
					  -ret, strerror(-ret));
		} else if (opts.syslog) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to syslog\n");

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_SYSLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate syslog (%d): %s\n",
					  -ret, strerror(-ret));
		} else if (opts.eventlog) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to eventlog\n");

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_EVENTLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate eventlog (%d): %s\n",
					  -ret, strerror(-ret));
		}
	}

	ret = proxy_start(&ph);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to start proxy (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxyd_exit;
	}

	proxy_log(&ph, LOG_LEVEL_INFO, "Ready.\n");

	/* Main dispatch loop */
	while (ret == 0 && sentinel == 0) {
		proxy_log(&ph, LOG_LEVEL_DEBUG,
			  "Starting a processing run...\n");
		ret = proxy_process(&ph);
		if (ret < 0) {
			switch (ret) {
			case -EINTR:
				ret = 0;

				/*! @TODO Something better than a busy loop */
				while (!sentinel) {
#ifdef _WIN32
					Sleep(50);
#else
					usleep(50000);
#endif
				}

				break;
			default:
				proxy_log(&ph, LOG_LEVEL_FATAL,
					  "Message processing failure (%d): %s\n",
					  -ret, strerror(-ret));
				break;
			}
		}
	}

	proxy_log(&ph, LOG_LEVEL_INFO, "Shutting down...\n");

proxyd_exit:
	proxy_free(&ph);

#ifdef _WIN32
	if (ret != 0) {
		HWND console_window = GetConsoleWindow();

		if (console_window != NULL) {
			DWORD process_id;

			GetWindowThreadProcessId(console_window, &process_id);
			if (GetCurrentProcessId() == process_id) {
				printf("Press any key to exit . . . ");
				_getch();
			}
		}
	}
#endif

	return ret;
}